

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

int Ses_ManCreateTruthTableClause(Ses_Man_t *pSes,int t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int i;
  int k;
  int iVar5;
  int pLits [3];
  
  iVar5 = pSes->nGates;
  if (iVar5 < 1) {
    iVar1 = pSes->nSpecFunc;
  }
  else {
    i = 0;
    do {
      iVar5 = pSes->nSpecVars;
      if (iVar5 + i != 0 && SCARRY4(iVar5,i) == iVar5 + i < 0) {
        iVar1 = 0;
        do {
          iVar3 = iVar1 + 1;
          iVar2 = iVar5 + i;
          k = iVar3;
          if (iVar3 < iVar2) {
            do {
              Ses_ManCreateMainClause(pSes,t,i,iVar1,k,0,0,1);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,k,0,1,0);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,k,0,1,1);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,k,1,0,0);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,k,1,0,1);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,k,1,1,0);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,k,1,1,1);
              k = k + 1;
              iVar5 = pSes->nSpecVars;
              iVar2 = iVar5 + i;
            } while (k < iVar2);
          }
          iVar1 = iVar3;
        } while (iVar3 < iVar2);
      }
      iVar5 = pSes->nSpecFunc;
      iVar1 = 1;
      if ((iVar5 != 1) && (iVar1 = iVar5, 0 < iVar5)) {
        iVar5 = 0;
        lVar4 = 0;
        do {
          if (pSes->nGates <= i) {
            __assert_fail("i < pSes->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3d3,"int Ses_ManOutputVar(Ses_Man_t *, int, int)");
          }
          iVar1 = pSes->nGates * (int)lVar4 + i + pSes->nOutputOffset;
          if (iVar1 < 0) goto LAB_002c323e;
          pLits[0] = iVar1 * 2 + 1;
          if (pSes->nRows <= t) goto LAB_002c325d;
          iVar1 = pSes->nRows * i + t + pSes->nSimOffset;
          if (iVar1 < 0) goto LAB_002c323e;
          pLits[1] = (uint)((pSes->pSpec[(long)iVar5 + (long)((int)(t + 1U) >> 6)] >>
                             (ulong)(t + 1U & 0x3f) & 1) != 0) + iVar1 * 2 ^ 1;
          iVar1 = sat_solver_addclause(pSes->pSat,pLits,pLits + 2);
          if (iVar1 == 0) {
            return 0;
          }
          lVar4 = lVar4 + 1;
          iVar1 = pSes->nSpecFunc;
          iVar5 = iVar5 + 4;
        } while (lVar4 < iVar1);
      }
      i = i + 1;
      iVar5 = pSes->nGates;
    } while (i < iVar5);
  }
  if (iVar1 == 1) {
    if (pSes->nRows <= t) {
LAB_002c325d:
      __assert_fail("t < pSes->nRows",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                    ,0x3cb,"int Ses_ManSimVar(Ses_Man_t *, int, int)");
    }
    iVar5 = pSes->nRows * (iVar5 + -1) + t + pSes->nSimOffset;
    if (iVar5 < 0) {
LAB_002c323e:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(pSes->vAssump,
                (uint)((pSes->pSpec[(int)(t + 1U) >> 6] >> ((ulong)(t + 1U) & 0x3f) & 1) != 0) +
                iVar5 * 2 ^ 1);
  }
  return 1;
}

Assistant:

static int inline Ses_ManCreateTruthTableClause( Ses_Man_t * pSes, int t )
{
    int i, j, k, h;
    int pLits[3];

    for ( i = 0; i < pSes->nGates; ++i )
    {
        /* main clauses */
        for ( j = 0; j < pSes->nSpecVars + i; ++j )
            for ( k = j + 1; k < pSes->nSpecVars + i; ++k )
            {
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 0, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 1, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 1, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 0, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 0, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 1, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 1, 1 );
            }

        /* output clauses */
        if ( pSes->nSpecFunc != 1 )
            for ( h = 0; h < pSes->nSpecFunc; ++h )
            {
                pLits[0] = Abc_Var2Lit( Ses_ManOutputVar( pSes, h, i ), 1 );
                pLits[1] = Abc_Var2Lit( Ses_ManSimVar( pSes, i, t ), 1 - Abc_TtGetBit( &pSes->pSpec[h << 2], t + 1 ) );
                if ( !sat_solver_addclause( pSes->pSat, pLits, pLits + 2 ) )
                    return 0;
            }
    }

    if ( pSes->nSpecFunc == 1 )
        Vec_IntPush( pSes->vAssump, Abc_Var2Lit( Ses_ManSimVar( pSes, pSes->nGates - 1, t ), 1 - Abc_TtGetBit( pSes->pSpec, t + 1 ) ) );

    return 1;
}